

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

bool BicTest3<Blob<128>,unsigned_int>(pfHash hash,int reps,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  int iVar4;
  ulong uVar5;
  byte in_DL;
  int in_ESI;
  code *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool result;
  int i;
  double b2;
  int b_1;
  double bias;
  int *bins_1;
  int *page_1;
  int keybit_1;
  int out2_1;
  int out1_1;
  uint32_t x;
  int *b;
  int out2;
  int out1;
  uint d;
  int irep;
  int *page;
  int keybit;
  vector<int,_std::allocator<int>_> bins;
  uint h2;
  uint h1;
  Blob<128> key;
  int maxB;
  int maxA;
  int maxK;
  double maxBias;
  Rand r;
  int pagesize;
  int hashbits;
  int hashbytes;
  int keybits;
  int keybytes;
  uint32_t in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  byte bVar8;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  vector<int,_std::allocator<int>_> *this;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  Rand *in_stack_ffffffffffffff10;
  int local_e4;
  double local_e0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint32_t local_b0;
  uint32_t local_ac;
  uint local_a8;
  int local_a4;
  reference local_a0;
  int local_98;
  undefined1 local_85 [33];
  uint local_64;
  uint local_60;
  Blob<128> local_5c;
  uint local_4c;
  uint local_48;
  uint local_44;
  double local_40;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  byte local_d;
  int local_c;
  code *local_8;
  
  local_d = in_DL & 1;
  local_14 = 0x10;
  local_18 = 0x80;
  local_1c = 4;
  local_20 = 0x20;
  local_24 = 0x1000;
  local_c = in_ESI;
  local_8 = in_RDI;
  Rand::Rand((Rand *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec);
  local_40 = 0.0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  Blob<128>::Blob(&local_5c);
  local_85._1_4_ = 0;
  this = (vector<int,_std::allocator<int>_> *)local_85;
  std::allocator<int>::allocator((allocator<int> *)0x12e181);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10,
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (value_type_conflict *)this,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::allocator<int>::~allocator((allocator<int> *)0x12e1af);
  for (local_98 = 0; local_98 < 0x80; local_98 = local_98 + 1) {
    if (local_98 % 0xc == 0) {
      printf(".");
    }
    local_a0 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_85 + 5),
                          (long)(local_98 << 0xc));
    for (local_a4 = 0; local_a4 < local_c; local_a4 = local_a4 + 1) {
      Rand::rand_p(in_stack_ffffffffffffff10,
                   (void *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                   (int)((ulong)this >> 0x20));
      (*local_8)(&local_5c,0x10,0,&local_60);
      flipbit<Blob<128>>((Blob<128> *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffeec);
      (*local_8)(&local_5c,0x10,0,&local_64);
      local_a8 = local_60 ^ local_64;
      for (local_ac = 0; local_b0 = local_ac, (int)local_ac < 0x1f; local_ac = local_ac + 1) {
        while (pvVar3 = local_a0, local_b0 = local_b0 + 1, (int)local_b0 < 0x20) {
          iVar4 = local_ac * 0x20 + local_b0;
          uVar1 = getbit<unsigned_int>(&local_a8,local_ac);
          uVar2 = getbit<unsigned_int>(&local_a8,local_b0);
          uVar5 = (ulong)(uVar1 | uVar2 << 1);
          pvVar3[(long)(iVar4 * 4) + uVar5] = pvVar3[(long)(iVar4 * 4) + uVar5] + 1;
        }
      }
    }
  }
  printf("\n");
  for (local_c0 = 0; local_c4 = local_c0, (int)local_c0 < 0x1f; local_c0 = local_c0 + 1) {
    while (local_c4 = local_c4 + 1, (int)local_c4 < 0x20) {
      if ((local_d & 1) != 0) {
        printf("(%3d,%3d) - ",(ulong)local_c0,(ulong)local_c4);
      }
      for (local_c8 = 0; (int)local_c8 < 0x80; local_c8 = local_c8 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_85 + 5),
                            (long)(int)(local_c8 << 0xc));
        local_e0 = 0.0;
        for (local_e4 = 0; local_e4 < 4; local_e4 = local_e4 + 1) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (double)pvVar3[(long)(int)((local_c0 * 0x20 + local_c4) * 4) +
                                        (long)local_e4] / (double)(local_c / 2);
          auVar6 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar6,ZEXT816(0xbff0000000000000));
          auVar7._8_8_ = 0x7fffffffffffffff;
          auVar7._0_8_ = 0x7fffffffffffffff;
          auVar6 = vpand_avx(auVar6,auVar7);
          if (local_e0 < auVar6._0_8_) {
            local_e0 = auVar6._0_8_;
          }
        }
        if (local_40 < local_e0) {
          local_40 = local_e0;
          local_44 = local_c8;
          local_48 = local_c0;
          local_4c = local_c4;
        }
        if ((local_d & 1) != 0) {
          if (0.01 <= local_e0) {
            if (0.05 <= local_e0) {
              if (0.33 <= local_e0) {
                printf("X");
              }
              else {
                printf("O");
              }
            }
            else {
              printf("o");
            }
          }
          else {
            printf(".");
          }
        }
      }
      if ((local_d & 1) != 0) {
        printf("\n");
      }
    }
    if ((local_d & 1) != 0) {
      for (iVar4 = 0; iVar4 < 0x8c; iVar4 = iVar4 + 1) {
        printf("-");
      }
      printf("\n");
    }
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",local_40,(ulong)local_44,(ulong)local_48,(ulong)local_4c)
  ;
  bVar8 = local_40 < 0.05;
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return (bool)(bVar8 & 1);
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}